

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenTrySetCatchTagAt(BinaryenExpressionRef expr,BinaryenIndex index,char *catchTag)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Name *this;
  Name local_38;
  BinaryenExpressionRef local_28;
  Expression *expression;
  char *catchTag_local;
  BinaryenExpressionRef pEStack_10;
  BinaryenIndex index_local;
  BinaryenExpressionRef expr_local;
  
  local_28 = expr;
  expression = (Expression *)catchTag;
  catchTag_local._4_4_ = index;
  pEStack_10 = expr;
  bVar1 = wasm::Expression::is<wasm::Try>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe7e,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  uVar2 = (ulong)catchTag_local._4_4_;
  sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&local_28[2].type);
  if (uVar2 < sVar3) {
    if (expression != (Expression *)0x0) {
      wasm::Name::Name(&local_38,(char *)expression);
      this = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&local_28[2].type,
                        (ulong)catchTag_local._4_4_);
      wasm::Name::operator=(this,&local_38);
      return;
    }
    __assert_fail("catchTag",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe80,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchTags.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe7f,
                "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)")
  ;
}

Assistant:

void BinaryenTrySetCatchTagAt(BinaryenExpressionRef expr,
                              BinaryenIndex index,
                              const char* catchTag) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchTags.size());
  assert(catchTag);
  static_cast<Try*>(expression)->catchTags[index] = catchTag;
}